

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  long lVar6;
  int iVar7;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  iVar7 = 0;
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar4 = (uint)*(undefined8 *)pObj;
    iVar7 = 1;
    if ((~uVar4 & 0x9fffffff) != 0) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x239,"int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = Gia_ObjId(p,pObj);
      lVar6 = 0;
      iVar7 = 0;
      while( true ) {
        pVVar1 = p->vMapping;
        iVar3 = Vec_IntEntry(pVVar1,iVar2);
        iVar3 = Vec_IntEntry(pVVar1,iVar3);
        if (iVar3 <= lVar6) break;
        pVVar1 = p->vMapping;
        uVar4 = Vec_IntEntry(pVVar1,iVar2);
        if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar3 = pVVar1->pArray[(ulong)uVar4 + lVar6 + 1];
        pObj_00 = Gia_ManObj(p,iVar3);
        iVar5 = Gia_ManLutLevelWithBoxes_rec(p,pObj_00);
        if (iVar5 != 0) {
          return 1;
        }
        iVar3 = Gia_ObjLevelId(p,iVar3);
        if (iVar7 <= iVar3) {
          iVar7 = iVar3;
        }
        lVar6 = lVar6 + 1;
      }
      Gia_ObjSetLevelId(p,iVar2,iVar7 + 1);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int Gia_ManLutLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj, k, iFan, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iObj = Gia_ObjId( p, pObj );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ManObj(p, iFan) ) )
            return 1;
        Level = Abc_MaxInt( Level, Gia_ObjLevelId(p, iFan) );
    }
    Gia_ObjSetLevelId( p, iObj, Level + 1 );
    return 0;
}